

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Position __thiscall AI::turn(AI *this,Position *other)

{
  bool bVar1;
  int iVar2;
  const_reference this_00;
  const_reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  value_type local_48;
  undefined1 local_40 [8];
  vector<Position,_std::allocator<Position>_> available;
  int j;
  int i;
  Position *other_local;
  AI *this_local;
  
  std::vector<Position,_std::allocator<Position>_>::vector
            ((vector<Position,_std::allocator<Position>_> *)local_40);
  for (available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0xf;
      available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    for (available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < 0xf;
        available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](this->board,
                             (long)available.super__Vector_base<Position,_std::allocator<Position>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this_00,(long)(int)available.
                                             super__Vector_base<Position,_std::allocator<Position>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pvVar3 == 0) {
        local_48.x = available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
        local_48.y = (int)available.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
        std::vector<Position,_std::allocator<Position>_>::push_back
                  ((vector<Position,_std::allocator<Position>_> *)local_40,&local_48);
      }
    }
  }
  bVar1 = std::vector<Position,_std::allocator<Position>_>::empty
                    ((vector<Position,_std::allocator<Position>_> *)local_40);
  if (bVar1) {
    this_local = (AI *)0x0;
  }
  else {
    iVar2 = rand();
    sVar4 = std::vector<Position,_std::allocator<Position>_>::size
                      ((vector<Position,_std::allocator<Position>_> *)local_40);
    pvVar5 = std::vector<Position,_std::allocator<Position>_>::operator[]
                       ((vector<Position,_std::allocator<Position>_> *)local_40,
                        (ulong)(long)iVar2 % sVar4);
    this_local = *(AI **)pvVar5;
  }
  std::vector<Position,_std::allocator<Position>_>::~vector
            ((vector<Position,_std::allocator<Position>_> *)local_40);
  return (Position)this_local;
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    vector<Position> available;

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                available.push_back(Position{i, j});
            }
        }
    }

    if (!available.empty()) {
        return available[rand() % available.size()];
    }

    return {0, 0};
}